

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O1

void __thiscall cmComputeLinkInformation::ComputeItemParserInfo(cmComputeLinkInformation *this)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmMakefile *this_00;
  char *pcVar3;
  size_t sVar4;
  _Base_ptr p_Var5;
  pointer pbVar6;
  string libext;
  string reg;
  string reg_static;
  string reg_any;
  string local_d8;
  undefined1 local_b8 [40];
  long *local_90 [2];
  long local_80 [2];
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  this_00 = this->Makefile;
  paVar2 = &local_d8.field_2;
  local_d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d8,"CMAKE_STATIC_LIBRARY_PREFIX","");
  pcVar3 = cmMakefile::GetDefinition(this_00,&local_d8);
  AddLinkPrefix(this,pcVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d8,"CMAKE_SHARED_LIBRARY_PREFIX","");
  pcVar3 = cmMakefile::GetDefinition(this_00,&local_d8);
  AddLinkPrefix(this,pcVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d8,"CMAKE_IMPORT_LIBRARY_SUFFIX","");
  pcVar3 = cmMakefile::GetDefinition(this_00,&local_d8);
  AddLinkExtension(this,pcVar3,LinkShared);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d8,"CMAKE_STATIC_LIBRARY_SUFFIX","");
  pcVar3 = cmMakefile::GetDefinition(this_00,&local_d8);
  AddLinkExtension(this,pcVar3,LinkStatic);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d8,"CMAKE_SHARED_LIBRARY_SUFFIX","");
  pcVar3 = cmMakefile::GetDefinition(this_00,&local_d8);
  AddLinkExtension(this,pcVar3,LinkShared);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d8,"CMAKE_LINK_LIBRARY_SUFFIX","");
  pcVar3 = cmMakefile::GetDefinition(this_00,&local_d8);
  AddLinkExtension(this,pcVar3,LinkUnknown);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d8,"CMAKE_EXTRA_LINK_EXTENSIONS","");
  pcVar3 = cmMakefile::GetDefinition(this_00,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (pcVar3 != (char *)0x0) {
    local_b8._0_8_ = (pointer)0x0;
    local_b8._8_8_ = (pointer)0x0;
    local_b8._16_8_ = (pointer)0x0;
    local_d8._M_dataplus._M_p = (pointer)paVar2;
    sVar4 = strlen(pcVar3);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,pcVar3,pcVar3 + sVar4);
    cmSystemTools::ExpandListArgument
              (&local_d8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_b8,false);
    pbVar6 = (pointer)local_b8._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      pbVar6 = (pointer)local_b8._0_8_;
    }
    for (; pbVar6 != (pointer)local_b8._8_8_; pbVar6 = pbVar6 + 1) {
      AddLinkExtension(this,(pbVar6->_M_dataplus)._M_p,LinkUnknown);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_b8);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d8,"CMAKE_EXTRA_SHARED_LIBRARY_SUFFIXES","");
  pcVar3 = cmMakefile::GetDefinition(this_00,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (pcVar3 != (char *)0x0) {
    local_b8._0_8_ = (pointer)0x0;
    local_b8._8_8_ = (pointer)0x0;
    local_b8._16_8_ = (pointer)0x0;
    local_d8._M_dataplus._M_p = (pointer)paVar2;
    sVar4 = strlen(pcVar3);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,pcVar3,pcVar3 + sVar4);
    cmSystemTools::ExpandListArgument
              (&local_d8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_b8,false);
    pbVar6 = (pointer)local_b8._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      pbVar6 = (pointer)local_b8._0_8_;
    }
    for (; pbVar6 != (pointer)local_b8._8_8_; pbVar6 = pbVar6 + 1) {
      AddLinkExtension(this,(pbVar6->_M_dataplus)._M_p,LinkShared);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_b8);
  }
  CreateExtensionRegex(&local_d8,this,&this->LinkExtensions,LinkUnknown);
  local_b8._0_8_ = local_b8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"(.*)","");
  std::__cxx11::string::_M_append(local_b8,(ulong)local_d8._M_dataplus._M_p);
  cmOrderDirectories::SetLinkExtensionInfo
            (this->OrderLinkerSearchPath,&this->LinkExtensions,(string *)local_b8);
  std::__cxx11::string::_M_replace((ulong)local_b8,0,(char *)local_b8._8_8_,0x59c504);
  p_Var5 = (this->LinkPrefixes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->LinkPrefixes)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var5 != p_Var1) {
    do {
      std::__cxx11::string::_M_append(local_b8,*(ulong *)(p_Var5 + 1));
      std::__cxx11::string::append(local_b8);
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var1);
  }
  std::__cxx11::string::append(local_b8);
  std::__cxx11::string::append(local_b8);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,local_b8._0_8_,
             (pointer)(local_b8._0_8_ + (long)(_Alloc_hider *)local_b8._8_8_));
  std::__cxx11::string::_M_append((char *)local_50,(ulong)local_d8._M_dataplus._M_p);
  cmsys::RegularExpression::compile(&this->ExtractAnyLibraryName,(char *)local_50[0]);
  if ((this->StaticLinkExtensions).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->StaticLinkExtensions).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_90,local_b8._0_8_,
               (pointer)(local_b8._0_8_ + (long)(_Alloc_hider *)local_b8._8_8_));
    CreateExtensionRegex(&local_70,this,&this->StaticLinkExtensions,LinkStatic);
    std::__cxx11::string::_M_append((char *)local_90,(ulong)local_70._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    cmsys::RegularExpression::compile(&this->ExtractStaticLibraryName,(char *)local_90[0]);
    if (local_90[0] != local_80) {
      operator_delete(local_90[0],local_80[0] + 1);
    }
  }
  if ((this->SharedLinkExtensions).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->SharedLinkExtensions).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_90,local_b8._0_8_,
               (pointer)(local_b8._0_8_ + (long)(_Alloc_hider *)local_b8._8_8_));
    CreateExtensionRegex(&local_70,this,&this->SharedLinkExtensions,LinkShared);
    std::__cxx11::string::operator=((string *)&this->SharedRegexString,(string *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_append
              ((char *)local_90,(ulong)(this->SharedRegexString)._M_dataplus._M_p);
    cmsys::RegularExpression::compile(&this->ExtractSharedLibraryName,(char *)local_90[0]);
    if (local_90[0] != local_80) {
      operator_delete(local_90[0],local_80[0] + 1);
    }
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if ((pointer)local_b8._0_8_ != (pointer)(local_b8 + 0x10)) {
    operator_delete((void *)local_b8._0_8_,(ulong)(local_b8._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmComputeLinkInformation::ComputeItemParserInfo()
{
  // Get possible library name prefixes.
  cmMakefile* mf = this->Makefile;
  this->AddLinkPrefix(mf->GetDefinition("CMAKE_STATIC_LIBRARY_PREFIX"));
  this->AddLinkPrefix(mf->GetDefinition("CMAKE_SHARED_LIBRARY_PREFIX"));

  // Import library names should be matched and treated as shared
  // libraries for the purposes of linking.
  this->AddLinkExtension(mf->GetDefinition("CMAKE_IMPORT_LIBRARY_SUFFIX"),
                         LinkShared);
  this->AddLinkExtension(mf->GetDefinition("CMAKE_STATIC_LIBRARY_SUFFIX"),
                         LinkStatic);
  this->AddLinkExtension(mf->GetDefinition("CMAKE_SHARED_LIBRARY_SUFFIX"),
                         LinkShared);
  this->AddLinkExtension(mf->GetDefinition("CMAKE_LINK_LIBRARY_SUFFIX"),
                         LinkUnknown);
  if(const char* linkSuffixes =
     mf->GetDefinition("CMAKE_EXTRA_LINK_EXTENSIONS"))
    {
    std::vector<std::string> linkSuffixVec;
    cmSystemTools::ExpandListArgument(linkSuffixes, linkSuffixVec);
    for(std::vector<std::string>::iterator i = linkSuffixVec.begin();
        i != linkSuffixVec.end(); ++i)
      {
      this->AddLinkExtension(i->c_str(), LinkUnknown);
      }
    }
  if(const char* sharedSuffixes =
     mf->GetDefinition("CMAKE_EXTRA_SHARED_LIBRARY_SUFFIXES"))
    {
    std::vector<std::string> sharedSuffixVec;
    cmSystemTools::ExpandListArgument(sharedSuffixes, sharedSuffixVec);
    for(std::vector<std::string>::iterator i = sharedSuffixVec.begin();
        i != sharedSuffixVec.end(); ++i)
      {
      this->AddLinkExtension(i->c_str(), LinkShared);
      }
    }

  // Compute a regex to match link extensions.
  std::string libext = this->CreateExtensionRegex(this->LinkExtensions,
                                                  LinkUnknown);

  // Create regex to remove any library extension.
  std::string reg("(.*)");
  reg += libext;
  this->OrderLinkerSearchPath->SetLinkExtensionInfo(this->LinkExtensions,
                                                    reg);

  // Create a regex to match a library name.  Match index 1 will be
  // the prefix if it exists and empty otherwise.  Match index 2 will
  // be the library name.  Match index 3 will be the library
  // extension.
  reg = "^(";
  for(std::set<std::string>::iterator p = this->LinkPrefixes.begin();
      p != this->LinkPrefixes.end(); ++p)
    {
    reg += *p;
    reg += "|";
    }
  reg += ")";
  reg += "([^/:]*)";

  // Create a regex to match any library name.
  std::string reg_any = reg;
  reg_any += libext;
#ifdef CM_COMPUTE_LINK_INFO_DEBUG
  fprintf(stderr, "any regex [%s]\n", reg_any.c_str());
#endif
  this->ExtractAnyLibraryName.compile(reg_any.c_str());

  // Create a regex to match static library names.
  if(!this->StaticLinkExtensions.empty())
    {
    std::string reg_static = reg;
    reg_static += this->CreateExtensionRegex(this->StaticLinkExtensions,
                                             LinkStatic);
#ifdef CM_COMPUTE_LINK_INFO_DEBUG
  fprintf(stderr, "static regex [%s]\n", reg_static.c_str());
#endif
    this->ExtractStaticLibraryName.compile(reg_static.c_str());
    }

  // Create a regex to match shared library names.
  if(!this->SharedLinkExtensions.empty())
    {
    std::string reg_shared = reg;
    this->SharedRegexString =
      this->CreateExtensionRegex(this->SharedLinkExtensions, LinkShared);
    reg_shared += this->SharedRegexString;
#ifdef CM_COMPUTE_LINK_INFO_DEBUG
  fprintf(stderr, "shared regex [%s]\n", reg_shared.c_str());
#endif
    this->ExtractSharedLibraryName.compile(reg_shared.c_str());
    }
}